

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 context,
          Parameters *param_4)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  VkAllocationCallbacks *pVVar5;
  Environment env;
  undefined1 local_790 [16];
  VkAllocationCallbacks *local_780;
  VkAllocationCallbacks *local_770;
  DestroyDeviceFunc local_768;
  VkAllocationCallbacks *local_760;
  DestroyDeviceFunc local_758;
  undefined8 local_750;
  Environment local_748;
  Resources local_710;
  Resources local_558;
  Resources local_3a0;
  Resources local_1e8;
  
  local_748.vkp = *(PlatformInterface **)(this + 8);
  local_750 = context;
  local_748.vkd = Context::getDeviceInterface((Context *)this);
  local_748.device = Context::getDevice((Context *)this);
  local_748.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_748.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_748.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_748.maxResourceConsumers = 1;
  Device::Resources::Resources(&local_1e8,&local_748,(Parameters *)&local_750);
  Device::Resources::Resources(&local_3a0,&local_748,(Parameters *)&local_750);
  Device::Resources::Resources(&local_558,&local_748,(Parameters *)&local_750);
  Device::Resources::Resources(&local_710,&local_748,(Parameters *)&local_750);
  Device::create((Move<vk::VkDevice_s_*> *)local_790,(Environment *)0x0,&local_1e8,param_4);
  uVar1 = local_790._0_8_;
  local_758 = (DestroyDeviceFunc)local_790._8_8_;
  local_760 = local_780;
  Device::create((Move<vk::VkDevice_s_*> *)local_790,(Environment *)0x0,&local_3a0,param_4);
  uVar2 = local_790._0_8_;
  local_768 = (DestroyDeviceFunc)local_790._8_8_;
  local_770 = local_780;
  Device::create((Move<vk::VkDevice_s_*> *)local_790,(Environment *)0x0,&local_558,param_4);
  pVVar5 = local_780;
  uVar4 = local_790._8_8_;
  uVar3 = local_790._0_8_;
  Device::create((Move<vk::VkDevice_s_*> *)local_790,(Environment *)0x0,&local_710,param_4);
  if ((VkDevice)local_790._0_8_ != (VkDevice)0x0) {
    (*(code *)local_790._8_8_)((VkDevice)local_790._0_8_,local_780);
  }
  if ((VkDevice)uVar3 != (VkDevice)0x0) {
    (*(code *)uVar4)((VkDevice)uVar3,pVVar5);
  }
  if ((VkDevice)uVar2 != (VkDevice)0x0) {
    (*local_768)((VkDevice)uVar2,local_770);
  }
  if ((VkDevice)uVar1 != (VkDevice)0x0) {
    (*local_758)((VkDevice)uVar1,local_760);
  }
  local_790._0_8_ = (VkDevice_s *)&local_780;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_790._0_8_,
             (DestroyDeviceFunc)(local_790._8_8_ + local_790._0_8_));
  if ((VkDevice_s *)local_790._0_8_ != (VkDevice_s *)&local_780) {
    operator_delete((void *)local_790._0_8_,(ulong)((long)&local_780->pUserData + 1));
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_710.vki);
  if (local_710.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_710.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_710.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_710.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_558.vki);
  if (local_558.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_558.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_558.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_558.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_3a0.vki);
  if (local_3a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_3a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_3a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_3a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}